

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O3

void av1_init_tile_data(AV1_COMP *cpi)

{
  byte bVar1;
  TokenList *(*papTVar2) [64];
  TileInfo *tile;
  char cVar3;
  MODE MVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  INTERNAL_COST_UPDATE_TYPE IVar8;
  TileDataEnc *pTVar9;
  byte bVar10;
  TokenExtra *pTVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  int local_8c;
  TokenExtra *local_80;
  TokenList *local_78;
  ulong local_68;
  TokenList *(*local_50) [64];
  
  bVar19 = ((cpi->common).seq_params)->monochrome == '\0';
  uVar13 = bVar19 + 1 + (uint)bVar19;
  uVar5 = (cpi->common).tiles.cols;
  uVar6 = (cpi->common).tiles.rows;
  local_80 = (cpi->token_info).tile_tok[0][0];
  papTVar2 = (cpi->token_info).tplist;
  local_78 = (cpi->token_info).tplist[0][0];
  if ((((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) &&
     ((cpi->common).features.allow_screen_content_tools == true)) {
    uVar17 = 2;
    if (uVar13 < 2) {
      uVar17 = uVar13;
    }
    uVar17 = ((cpi->common).mi_params.mb_cols + 7U >> 3) *
             ((cpi->common).mi_params.mb_rows + 7U >> 3) * uVar17 * 0x4000;
    if ((cpi->token_info).tokens_allocated < uVar17) {
      aom_free(local_80);
      (cpi->token_info).tile_tok[0][0] = (TokenExtra *)0x0;
      aom_free((cpi->token_info).tplist[0][0]);
      (cpi->token_info).tplist[0][0] = (TokenList *)0x0;
      iVar7 = (cpi->common).mi_params.mi_rows;
      bVar1 = (byte)((cpi->common).seq_params)->mib_size_log2;
      (cpi->token_info).tokens_allocated = uVar17;
      pTVar11 = (TokenExtra *)aom_calloc((ulong)uVar17,1);
      (cpi->token_info).tile_tok[0][0] = pTVar11;
      if (pTVar11 == (TokenExtra *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate token_info->tile_tok[0][0]");
      }
      local_78 = (TokenList *)
                 aom_calloc((long)((iVar7 + (1 << (bVar1 & 0x1f)) + -1 >> (bVar1 & 0x1f)) << 0xc),
                            0x10);
      (*papTVar2)[0] = local_78;
      if (local_78 == (TokenList *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate token_info->tplist[0][0]");
        local_78 = (cpi->token_info).tplist[0][0];
      }
      local_80 = (cpi->token_info).tile_tok[0][0];
    }
  }
  if (0 < (int)uVar6) {
    uVar17 = 2;
    if (uVar13 < 2) {
      uVar17 = uVar13;
    }
    lVar16 = 0;
    local_68 = 0;
    local_8c = 0;
    uVar18 = 0;
    local_50 = papTVar2;
    do {
      if (0 < (int)uVar5) {
        uVar14 = 0;
        lVar15 = lVar16;
        do {
          pTVar9 = cpi->tile_data;
          tile = (TileInfo *)((long)((pTVar9->tctx).txb_skip_cdf + -1) + 0x2e + lVar15);
          av1_tile_init(tile,&cpi->common,(int)local_68,(int)uVar14);
          *(undefined4 *)((long)&(pTVar9->firstpass_top_mv).row + lVar15) = 0;
          *(undefined8 *)((long)pTVar9->inter_mode_rd_models + lVar15 + -0x10) = 0;
          if (((cpi->token_info).tile_tok[0][0] != (TokenExtra *)0x0) &&
             ((*papTVar2)[0] != (TokenList *)0x0)) {
            local_80 = local_80 + uVar18;
            (*(TokenExtra *(*) [64])(local_50 + -0x40))[uVar14] = local_80;
            cVar3 = (char)((cpi->common).seq_params)->mib_size_log2;
            bVar1 = cVar3 + 2;
            bVar10 = cVar3 - 2;
            uVar13 = ~(-1 << (bVar10 & 0x1f));
            uVar18 = (ulong)(((int)(uVar13 + ((*(int *)((long)((pTVar9->tctx).txb_skip_cdf + -1) +
                                                        0x3a + lVar15) -
                                              *(int *)((long)((pTVar9->tctx).txb_skip_cdf + -1) +
                                                       0x36 + lVar15)) + 2 >> 2)) >> (bVar10 & 0x1f)
                             ) * ((int)(((*(int *)((long)((pTVar9->tctx).txb_skip_cdf + -1) + 0x32 +
                                                  lVar15) -
                                         *(int *)((long)((pTVar9->tctx).txb_skip_cdf + -1) + 0x2e +
                                                 lVar15)) + 2 >> 2) + uVar13) >> (bVar10 & 0x1f)) *
                            ((1 << (bVar1 & 0x1f)) << (bVar1 & 0x1f)) * uVar17);
            local_78 = local_78 + local_8c;
            (*local_50)[uVar14] = local_78;
            local_8c = av1_get_sb_rows_in_tile(&cpi->common,tile);
          }
          if (((cpi->common).tiles.large_scale == 0) &&
             ((cpi->common).features.disable_cdf_update == false)) {
            MVar4 = (cpi->oxcf).mode;
            bVar19 = true;
            if (MVar4 == '\x01') {
              if (((cpi->sf).inter_sf.coeff_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET) &&
                 ((cpi->sf).inter_sf.mode_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET)) {
                lVar12 = 0x60b00;
                IVar8 = (cpi->sf).intra_sf.dv_cost_upd_level;
                goto joined_r0x001aa0e8;
              }
            }
            else if ((MVar4 == '\x02') &&
                    ((cpi->sf).inter_sf.coeff_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET)) {
              lVar12 = 0x60ba8;
              IVar8 = (cpi->sf).inter_sf.mode_cost_upd_level;
joined_r0x001aa0e8:
              if (IVar8 < INTERNAL_COST_UPD_SBROW_SET) {
                bVar19 = 1 < *(uint *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) +
                                      lVar12);
              }
            }
          }
          else {
            bVar19 = false;
          }
          *(bool *)((long)pTVar9->inter_mode_rd_models + lVar15 + -8) = bVar19;
          memcpy((void *)((long)(pTVar9->tctx).txb_skip_cdf[0][0] + lVar15),(cpi->common).fc,0x52fc)
          ;
          uVar14 = uVar14 + 1;
          lVar15 = lVar15 + 0x5d10;
        } while (uVar5 != uVar14);
      }
      local_68 = local_68 + 1;
      lVar16 = lVar16 + (ulong)uVar5 * 0x5d10;
      local_50 = local_50 + 1;
    } while (local_68 != uVar6);
  }
  return;
}

Assistant:

void av1_init_tile_data(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int tile_col, tile_row;
  TokenInfo *const token_info = &cpi->token_info;
  TokenExtra *pre_tok = token_info->tile_tok[0][0];
  TokenList *tplist = token_info->tplist[0][0];
  unsigned int tile_tok = 0;
  int tplist_count = 0;

  if (!is_stat_generation_stage(cpi) &&
      cm->features.allow_screen_content_tools) {
    // Number of tokens for which token info needs to be allocated.
    unsigned int tokens_required =
        get_token_alloc(cm->mi_params.mb_rows, cm->mi_params.mb_cols,
                        MAX_SB_SIZE_LOG2, num_planes);
    // Allocate/reallocate memory for token related info if the number of tokens
    // required is more than the number of tokens already allocated. This could
    // occur in case of the following:
    // 1) If the memory is not yet allocated
    // 2) If the frame dimensions have changed
    const bool realloc_tokens = tokens_required > token_info->tokens_allocated;
    if (realloc_tokens) {
      free_token_info(token_info);
      alloc_token_info(cm, token_info, tokens_required);
      pre_tok = token_info->tile_tok[0][0];
      tplist = token_info->tplist[0][0];
    }
  }

  for (tile_row = 0; tile_row < tile_rows; ++tile_row) {
    for (tile_col = 0; tile_col < tile_cols; ++tile_col) {
      TileDataEnc *const tile_data =
          &cpi->tile_data[tile_row * tile_cols + tile_col];
      TileInfo *const tile_info = &tile_data->tile_info;
      av1_tile_init(tile_info, cm, tile_row, tile_col);
      tile_data->firstpass_top_mv = kZeroMv;
      tile_data->abs_sum_level = 0;

      if (is_token_info_allocated(token_info)) {
        token_info->tile_tok[tile_row][tile_col] = pre_tok + tile_tok;
        pre_tok = token_info->tile_tok[tile_row][tile_col];
        tile_tok = allocated_tokens(
            tile_info, cm->seq_params->mib_size_log2 + MI_SIZE_LOG2,
            num_planes);
        token_info->tplist[tile_row][tile_col] = tplist + tplist_count;
        tplist = token_info->tplist[tile_row][tile_col];
        tplist_count = av1_get_sb_rows_in_tile(cm, tile_info);
      }
      tile_data->allow_update_cdf = !cm->tiles.large_scale;
      tile_data->allow_update_cdf = tile_data->allow_update_cdf &&
                                    !cm->features.disable_cdf_update &&
                                    !delay_wait_for_top_right_sb(cpi);
      tile_data->tctx = *cm->fc;
    }
  }
}